

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateFunction::StateCombine<duckdb::BitState<unsigned_int>,duckdb::BitXorOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  uint uVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  char *pcVar4;
  idx_t iVar5;
  
  if (count != 0) {
    pdVar2 = source->data;
    pdVar3 = target->data;
    iVar5 = 0;
    do {
      if (**(char **)(pdVar2 + iVar5 * 8) == '\x01') {
        pcVar4 = *(char **)(pdVar3 + iVar5 * 8);
        uVar1 = *(uint *)(*(char **)(pdVar2 + iVar5 * 8) + 4);
        if (*pcVar4 == '\0') {
          *(uint *)(pcVar4 + 4) = uVar1;
          *pcVar4 = '\x01';
        }
        else {
          *(uint *)(pcVar4 + 4) = *(uint *)(pcVar4 + 4) ^ uVar1;
        }
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}